

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

void __thiscall siamese::EncoderPacketWindow::ClearWindow(EncoderPacketWindow *this)

{
  ulong uVar1;
  uint sumIndex;
  EncoderColumnLane *lane;
  uint laneIndex;
  EncoderPacketWindow *this_local;
  
  this->FirstUnremovedElement = 0;
  this->Count = 0;
  this->LongestPacket = 0;
  this->SumStartElement = 0;
  this->SumEndElement = 0;
  for (laneIndex = 0; laneIndex < 8; laneIndex = laneIndex + 1) {
    uVar1 = (ulong)laneIndex;
    for (sumIndex = 0; sumIndex < 3; sumIndex = sumIndex + 1) {
      this->Lanes[uVar1].Sum[sumIndex].Bytes = 0;
      this->Lanes[uVar1].NextElement[sumIndex] = laneIndex;
    }
    this->Lanes[uVar1].LongestPacket = 0;
  }
  return;
}

Assistant:

void EncoderPacketWindow::ClearWindow()
{
    FirstUnremovedElement = 0;
    Count                 = 0;
    LongestPacket         = 0;
    SumStartElement       = 0;
    SumEndElement         = 0;

    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
    {
        EncoderColumnLane& lane = Lanes[laneIndex];

        for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
        {
            lane.Sum[sumIndex].Bytes   = 0;
            lane.NextElement[sumIndex] = laneIndex;
        }
        lane.LongestPacket = 0;
    }
}